

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureCubeArray_GL.cpp
# Opt level: O0

void __thiscall
Diligent::TextureCubeArray_GL::TextureCubeArray_GL
          (TextureCubeArray_GL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,GLuint GLTextureHandle,GLuint GLBindTarget,
          bool bIsDeviceInternal)

{
  GLenum local_74;
  bool bIsDeviceInternal_local;
  TextureDesc *TexDesc_local;
  GLContextState *GLState_local;
  RenderDeviceGLImpl *pDeviceGL_local;
  FixedBlockMemoryAllocator *TexViewObjAllocator_local;
  IReferenceCounters *pRefCounters_local;
  TextureCubeArray_GL *this_local;
  
  if (GLBindTarget == 0) {
    local_74 = 0x9009;
  }
  else {
    local_74 = GLBindTarget;
  }
  TextureBaseGL::TextureBaseGL
            (&this->super_TextureBaseGL,pRefCounters,TexViewObjAllocator,pDeviceGL,GLState,TexDesc,
             GLTextureHandle,local_74,bIsDeviceInternal);
  (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture = (ITexture)&PTR_QueryInterface_013a6520;
  return;
}

Assistant:

TextureCubeArray_GL::TextureCubeArray_GL(IReferenceCounters*        pRefCounters,
                                         FixedBlockMemoryAllocator& TexViewObjAllocator,
                                         RenderDeviceGLImpl*        pDeviceGL,
                                         GLContextState&            GLState,
                                         const TextureDesc&         TexDesc,
                                         GLuint                     GLTextureHandle,
                                         GLuint                     GLBindTarget,
                                         bool                       bIsDeviceInternal) :
    // clang-format off
    TextureBaseGL
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        GLState,
        TexDesc,
        GLTextureHandle,
        static_cast<GLenum>(GLBindTarget != 0 ? GLBindTarget : GL_TEXTURE_CUBE_MAP_ARRAY),
        bIsDeviceInternal
    }
// clang-format on
{
}